

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

Status google::protobuf::json_internal::anon_unknown_5::
       ParseFieldMask<google::protobuf::json_internal::ParseProto2Descriptor>
                 (JsonLexer *lex,Desc<google::protobuf::json_internal::ParseProto2Descriptor> *desc,
                 Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  Status extraout_RAX;
  undefined8 uVar5;
  Field in_RCX;
  char cVar6;
  char *in_R8;
  size_t sVar7;
  string_view sVar8;
  string snake_path;
  const_iterator __begin3;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  str;
  undefined1 *local_108;
  Msg *local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_e8;
  Field local_b8;
  Field local_b0;
  Desc<google::protobuf::json_internal::ParseProto2Descriptor> *local_a8;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_a0;
  MaybeOwnedString local_98;
  undefined1 local_68 [32];
  Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  
  local_b0 = in_RCX;
  local_a8 = desc;
  JsonLexer::ParseUtf8
            ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              *)&local_a0.status_,(JsonLexer *)desc);
  (lex->stream_).stream_ = (ZeroCopyInputStream *)local_a0;
  if (((ulong)local_a0 & 1) == 0) {
    LOCK();
    *(int *)local_a0 = *(int *)local_a0 + 1;
    UNLOCK();
  }
  if (local_a0 ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
       )0x1) {
    sVar8 = MaybeOwnedString::AsView(&local_98);
    sVar4 = sVar8._M_len;
    if (sVar4 != 0) {
      local_b8 = Proto2Descriptor::MustHaveField(msg,1);
      local_e8.splitter_ = &local_48;
      local_48.delimiter_.c_ = ',';
      local_e8.pos_ = 0;
      local_e8.state_ = kInitState;
      local_e8.curr_._M_len = 0;
      local_e8.curr_._M_str = (char *)0x0;
      local_e8.delimiter_.c_ = ',';
      local_48.text_ = sVar8;
      if (sVar8._M_str == (char *)0x0) {
        local_e8.state_ = kEndState;
        local_e8.pos_ = sVar4;
      }
      else {
        absl::lts_20240722::strings_internal::
        SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator++(&local_e8);
        sVar4 = local_48.text_._M_len;
      }
      while ((pcVar3 = local_e8.curr_._M_str, sVar2 = local_e8.curr_._M_len,
             local_e8.state_ != kEndState || (local_e8.pos_ != sVar4))) {
        local_108 = &local_f8;
        local_100 = (Msg *)0x0;
        local_f8 = 0;
        std::__cxx11::string::reserve((ulong)&local_108);
        if (sVar2 != 0) {
          sVar7 = 0;
          do {
            cVar1 = pcVar3[sVar7];
            cVar6 = (char)&local_108;
            if ((9 < (byte)(cVar1 - 0x30U)) && (cVar1 != '.' && 0x19 < (byte)(cVar1 + 0x9fU))) {
              if ((byte)(cVar1 + 0xbfU) < 0x1a) {
                std::__cxx11::string::push_back(cVar6);
              }
              else if (*(char *)&local_a8->extension_ranges_ == '\0') {
                if (local_a0 !=
                    (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                     )0x1) {
                  uVar5 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_a0.status_);
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                   *)&local_a0.status_);
                  _Unwind_Resume(uVar5);
                }
                JsonLocation::Invalid
                          ((JsonLocation *)lex,local_68,0x21,"unexpected character in FieldMask");
                if (local_108 != &local_f8) {
                  operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
                }
                goto LAB_002bf671;
              }
            }
            std::__cxx11::string::push_back(cVar6);
            sVar7 = sVar7 + 1;
          } while (sVar2 != sVar7);
        }
        sVar8._M_str = in_R8;
        sVar8._M_len = (size_t)local_108;
        ParseProto2Descriptor::SetString((ParseProto2Descriptor *)local_b8,local_b0,local_100,sVar8)
        ;
        if (local_108 != &local_f8) {
          operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
        }
        absl::lts_20240722::strings_internal::
        SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator++(&local_e8);
      }
    }
    (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
  }
LAB_002bf671:
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)&local_a0.status_);
  return (Status)extraout_RAX.rep_;
}

Assistant:

absl::Status ParseFieldMask(JsonLexer& lex, const Desc<Traits>& desc,
                            Msg<Traits>& msg) {
  absl::StatusOr<LocationWith<MaybeOwnedString>> str = lex.ParseUtf8();
  RETURN_IF_ERROR(str.status());
  auto paths = str->value.AsView();

  // The special case of the empty string is not handled correctly below,
  // because StrSplit("", ',') is [""], not [].
  if (paths.empty()) {
    return absl::OkStatus();
  }

  // google.protobuf.FieldMask has a single field with number 1.
  auto paths_field = Traits::MustHaveField(desc, 1);
  for (absl::string_view path : absl::StrSplit(paths, ',')) {
    std::string snake_path;
    // Assume approximately six-letter words, so add one extra space for an
    // underscore for every six bytes.
    snake_path.reserve(path.size() * 7 / 6);
    for (char c : path) {
      if (absl::ascii_isdigit(c) || absl::ascii_islower(c) || c == '.') {
        snake_path.push_back(c);
      } else if (absl::ascii_isupper(c)) {
        snake_path.push_back('_');
        snake_path.push_back(absl::ascii_tolower(c));
      } else if (lex.options().allow_legacy_syntax) {
        snake_path.push_back(c);
      } else {
        return str->loc.Invalid("unexpected character in FieldMask");
      }
    }
    Traits::SetString(paths_field, msg, snake_path);
  }

  return absl::OkStatus();
}